

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O3

void __thiscall
ElementsAddressFactory_CreatePegInAddress4_Test::~ElementsAddressFactory_CreatePegInAddress4_Test
          (ElementsAddressFactory_CreatePegInAddress4_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ElementsAddressFactory, CreatePegInAddress4)
{
  Script tweak_fedpegscript("522102baae8e066e4f2a1da4b731017697bb8fcacc60e4569f3ec27bc31cf3fb13246221026bccd050e8ecf7a702bc9fb63205cfdf278a22ba8b1f1d3ca3d8e5b38465a9702103430d354b89d1fbe43eb54ea138a4aee1076e4c54f4c805f62f9cee965351a1d053ae");
  ElementsAddressFactory factory(NetType::kMainnet);
  Address address;

  EXPECT_NO_THROW(address = factory.CreatePegInAddress(AddressType::kP2wshAddress, tweak_fedpegscript));
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qwne950c4casaxjk3z8tfgegldck80fcn9rlsy2fy4zzc577hsjuqkdlnyh");
  EXPECT_NO_THROW(address = factory.CreatePegInAddress(AddressType::kP2shP2wshAddress, tweak_fedpegscript));
  EXPECT_STREQ(address.GetAddress().c_str(), "3GXYs13Pg4HTA47TXccjYtRwkvbwJmyS4x");
  EXPECT_NO_THROW(address = factory.CreatePegInAddress(AddressType::kP2shAddress, tweak_fedpegscript));
  EXPECT_STREQ(address.GetAddress().c_str(), "33erViQQNHfST9W4qkVTa2p8mtM7SKv86F");

  EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2wpkhAddress, tweak_fedpegscript), CfdException);
  EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2shP2wpkhAddress, tweak_fedpegscript), CfdException);
  EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2pkhAddress, tweak_fedpegscript), CfdException);
}